

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StyleSheetContainer.cpp
# Opt level: O1

void __thiscall
Rml::StyleSheetContainer::MergeStyleSheetContainer
          (StyleSheetContainer *this,StyleSheetContainer *other)

{
  code *pcVar1;
  bool bVar2;
  MediaBlock *block_other;
  pointer __args;
  
  if (this->compiled_style_sheet != (StyleSheet *)0x0) {
    bVar2 = Assert("RMLUI_ASSERT(!compiled_style_sheet)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/StyleSheetContainer.cpp"
                   ,0xd4);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  __args = (other->media_blocks).
           super__Vector_base<Rml::MediaBlock,_std::allocator<Rml::MediaBlock>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (__args != (other->media_blocks).
                super__Vector_base<Rml::MediaBlock,_std::allocator<Rml::MediaBlock>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      ::std::vector<Rml::MediaBlock,std::allocator<Rml::MediaBlock>>::
      emplace_back<Rml::PropertyDictionary_const&,std::shared_ptr<Rml::StyleSheet>const&,Rml::MediaQueryModifier_const&>
                ((vector<Rml::MediaBlock,std::allocator<Rml::MediaBlock>> *)&this->media_blocks,
                 &__args->properties,&__args->stylesheet,&__args->modifier);
      __args = __args + 1;
    } while (__args != (other->media_blocks).
                       super__Vector_base<Rml::MediaBlock,_std::allocator<Rml::MediaBlock>_>._M_impl
                       .super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void StyleSheetContainer::MergeStyleSheetContainer(const StyleSheetContainer& other)
{
	RMLUI_ZoneScoped;

	// Style sheet container must not be merged after it's been compiled. This will invalidate references to the compiled style sheet.
	RMLUI_ASSERT(!compiled_style_sheet);

	auto it_other_begin = other.media_blocks.begin();

#if 0
	// If the last block here has the same media requirements as the first block in other, we can safely merge them
	// while retaining correct specificity of all properties. This is essentially an optimization to avoid more
	// style sheet merging later on.
	if (!media_blocks.empty() && !other.media_blocks.empty())
	{
		MediaBlock& block_local = media_blocks.back();
		const MediaBlock& block_other = other.media_blocks.front();
		if (block_local.properties.GetProperties() == block_other.properties.GetProperties())
		{
			// Now we can safely merge the two style sheets.
			block_local.stylesheet = block_local.stylesheet->CombineStyleSheet(*block_other.stylesheet);

			// And we need to skip the first media block in the 'other' style sheet, since we merged it just now.
			++it_other_begin;
		}
	}
#endif

	// Add all the other blocks into ours.
	for (auto it = it_other_begin; it != other.media_blocks.end(); ++it)
	{
		const MediaBlock& block_other = *it;
		media_blocks.emplace_back(block_other.properties, block_other.stylesheet, block_other.modifier);
	}
}